

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
cfd::core::ScriptElement::SerializeScriptNum
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          int64_t value)

{
  byte *pbVar1;
  ulong local_58;
  value_type local_29;
  ulong local_28;
  uint64_t abstract_value;
  bool is_negative;
  ulong uStack_18;
  int64_t value_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  
  uStack_18 = value;
  value_local = (int64_t)__return_storage_ptr__;
  if (value == 0) {
    memset(__return_storage_ptr__,0,0x18);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3fcaab);
  }
  else {
    abstract_value._7_1_ = 0;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3fcabd);
    abstract_value._6_1_ = (long)uStack_18 < 0;
    if ((bool)abstract_value._6_1_) {
      local_58 = -uStack_18;
    }
    else {
      local_58 = uStack_18;
    }
    for (local_28 = local_58; local_28 != 0; local_28 = local_28 >> 8) {
      local_29 = (value_type)local_28;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
                 &local_29);
    }
    pbVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        __return_storage_ptr__);
    if ((*pbVar1 & 0x80) == 0) {
      if ((abstract_value._6_1_ & 1) != 0) {
        pbVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            __return_storage_ptr__);
        *pbVar1 = *pbVar1 | 0x80;
      }
    }
    else if ((abstract_value._6_1_ & 1) == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
                 &stack0xffffffffffffffc2);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
                 &stack0xffffffffffffffc3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> ScriptElement::SerializeScriptNum(int64_t value) {
  if (value == 0) {
    return std::vector<uint8_t>();
  }

  std::vector<uint8_t> result;
  const bool is_negative = value < 0;
  uint64_t abstract_value = is_negative ? -value : value;

  while (abstract_value) {
    result.push_back(abstract_value & 0xff);
    abstract_value >>= 8;
  }

  if (result.back() & 0x80) {
    if (is_negative) {
      result.push_back(0x80);
    } else {
      result.push_back(0x00);
    }
  } else if (is_negative) {
    result.back() |= 0x80;
  }

  return result;
}